

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O1

idx_t __thiscall
duckdb::WindowTokenTree::Rank(WindowTokenTree *this,idx_t lower,idx_t upper,idx_t row_idx)

{
  uint uVar1;
  pointer puVar2;
  value_type vVar3;
  pointer puVar4;
  bool bVar5;
  type this_00;
  const_reference pvVar6;
  const_reference pvVar7;
  type this_01;
  const_reference pvVar8;
  const_reference pvVar9;
  unsigned_long uVar10;
  long lVar11;
  vector<unsigned_long,_true> *this_02;
  ulong uVar12;
  unsigned_long uVar13;
  vector<unsigned_int,_true> *this_03;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  idx_t run_begin;
  idx_t iVar17;
  ulong uVar18;
  size_type sVar19;
  size_type sVar20;
  ulong *puVar21;
  ulong *puVar22;
  uint *puVar23;
  uint *puVar24;
  unsigned_long run_begin_1;
  long lVar25;
  idx_t iVar26;
  idx_t iVar27;
  ulong uVar28;
  ulong uVar29;
  ulong local_98;
  ulong local_88;
  size_type local_60;
  size_type local_58;
  
  local_98 = lower;
  if ((this->super_WindowMergeSortTree).mst64.
      super_unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      .
      super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_false>
      ._M_head_impl ==
      (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *)0x0) {
    this_01 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
              ::operator*(&(this->super_WindowMergeSortTree).mst32);
    pvVar8 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
             ::operator[](&this_01->tree,0);
    pvVar9 = vector<unsigned_int,_true>::operator[](&pvVar8->first,row_idx);
    iVar27 = 1;
    if (lower < upper) {
      iVar26 = upper - 1;
      iVar17 = lower;
      if (iVar26 == lower) {
        uVar12 = 0;
        sVar19 = 0;
        local_88 = 1;
      }
      else {
        local_88 = 1;
        sVar19 = 0;
        do {
          uVar12 = iVar26;
          iVar17 = iVar17 >> 5;
          iVar26 = uVar12 >> 5;
          local_88 = local_88 * 0x20;
          sVar19 = sVar19 + 1;
        } while (iVar17 != iVar26);
        local_98 = local_88 * uVar12 >> 5;
      }
      uVar1 = *pvVar9;
      uVar16 = local_98;
      if (2 < sVar19) {
        uVar28 = iVar17 * local_88;
        pvVar8 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this_01->tree,0);
        uVar15 = (long)(pvVar8->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar8->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        if (uVar28 + local_88 <= uVar15) {
          uVar15 = uVar28 + local_88;
        }
        pvVar8 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this_01->tree,sVar19);
        puVar4 = (pvVar8->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar24 = puVar4 + uVar28;
        uVar18 = uVar15 - uVar28;
        if (uVar18 != 0 && (long)uVar28 <= (long)uVar15) {
          do {
            uVar15 = uVar18 >> 1;
            uVar29 = ~uVar15 + uVar18;
            uVar18 = uVar15;
            if (puVar24[uVar15] < uVar1) {
              puVar24 = puVar24 + uVar15 + 1;
              uVar18 = uVar29;
            }
          } while (0 < (long)uVar18);
        }
        uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                           ((long)puVar24 - (long)puVar4 >> 2);
        lVar11 = (uVar28 / local_88) * 0x40;
        lVar25 = uVar12 + iVar26 * -0x20 + (uVar10 & 0xffffffffffffffe0);
        local_60 = lVar11 + lVar25;
        local_58 = (lVar11 + lVar25) - 0x20;
        iVar27 = 1;
        uVar12 = sVar19;
        do {
          sVar19 = uVar12 - 1;
          local_88 = local_88 >> 5;
          pvVar8 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::operator[](&this_01->tree,sVar19);
          puVar4 = (pvVar8->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar8 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::operator[](&this_01->tree,uVar12);
          this_03 = &pvVar8->second;
          local_58 = local_58 + 0x1f;
          uVar15 = local_98 - lower;
          while (local_88 <= uVar15) {
            pvVar9 = vector<unsigned_int,_true>::operator[](this_03,local_58);
            uVar28 = (ulong)*pvVar9;
            puVar24 = puVar4 + uVar28;
            pvVar9 = vector<unsigned_int,_true>::operator[](this_03,local_58 + 0x20);
            uVar15 = *pvVar9 - uVar28;
            if (uVar15 != 0 && uVar28 <= *pvVar9) {
              do {
                uVar28 = uVar15 >> 1;
                uVar18 = ~uVar28 + uVar15;
                uVar15 = uVar28;
                if (puVar24[uVar28] < uVar1) {
                  puVar24 = puVar24 + uVar28 + 1;
                  uVar15 = uVar18;
                }
              } while (0 < (long)uVar15);
            }
            local_98 = local_98 - local_88;
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar24 - (long)puVar4 >> 2);
            iVar27 = iVar27 + (uVar10 - local_98);
            local_58 = local_58 - 1;
            uVar15 = local_98 - lower;
          }
          if (local_98 != lower) {
            pvVar9 = vector<unsigned_int,_true>::operator[](this_03,local_58);
            uVar28 = (ulong)*pvVar9;
            puVar24 = puVar4 + uVar28;
            pvVar9 = vector<unsigned_int,_true>::operator[](this_03,local_58 + 0x20);
            uVar15 = *pvVar9 - uVar28;
            if (uVar15 != 0 && uVar28 <= *pvVar9) {
              do {
                uVar28 = uVar15 >> 1;
                uVar18 = ~uVar28 + uVar15;
                uVar15 = uVar28;
                if (puVar24[uVar28] < uVar1) {
                  puVar24 = puVar24 + uVar28 + 1;
                  uVar15 = uVar18;
                }
              } while (0 < (long)uVar15);
            }
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar24 - (long)puVar4 >> 2);
            local_58 = (lower / local_88) * 0x40 + (uVar10 & 0xffffffffffffffe0);
          }
          for (; local_88 <= upper - uVar16; uVar16 = uVar16 + local_88) {
            pvVar9 = vector<unsigned_int,_true>::operator[](this_03,local_60);
            uVar28 = (ulong)*pvVar9;
            puVar24 = puVar4 + uVar28;
            pvVar9 = vector<unsigned_int,_true>::operator[](this_03,local_60 + 0x20);
            uVar15 = *pvVar9 - uVar28;
            if (uVar15 != 0 && uVar28 <= *pvVar9) {
              do {
                uVar28 = uVar15 >> 1;
                uVar18 = ~uVar28 + uVar15;
                uVar15 = uVar28;
                if (puVar24[uVar28] < uVar1) {
                  puVar24 = puVar24 + uVar28 + 1;
                  uVar15 = uVar18;
                }
              } while (0 < (long)uVar15);
            }
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar24 - (long)puVar4 >> 2);
            iVar27 = iVar27 + (uVar10 - uVar16);
            local_60 = local_60 + 1;
          }
          if (uVar16 != upper) {
            pvVar9 = vector<unsigned_int,_true>::operator[](this_03,local_60);
            uVar28 = (ulong)*pvVar9;
            puVar24 = puVar4 + uVar28;
            pvVar9 = vector<unsigned_int,_true>::operator[](this_03,local_60 + 0x20);
            uVar15 = *pvVar9 - uVar28;
            if (uVar15 != 0 && uVar28 <= *pvVar9) {
              do {
                uVar28 = uVar15 >> 1;
                uVar18 = ~uVar28 + uVar15;
                uVar15 = uVar28;
                if (puVar24[uVar28] < uVar1) {
                  puVar24 = puVar24 + uVar28 + 1;
                  uVar15 = uVar18;
                }
              } while (0 < (long)uVar15);
            }
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar24 - (long)puVar4 >> 2);
            local_60 = (upper / local_88) * 0x40 + (uVar10 & 0xffffffffffffffe0);
          }
          bVar5 = 2 < uVar12;
          uVar12 = sVar19;
        } while (bVar5);
      }
      if (1 < sVar19) {
        sVar19 = sVar19 - 1;
        do {
          uVar15 = local_88 >> 5;
          pvVar8 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::operator[](&this_01->tree,sVar19);
          puVar4 = (pvVar8->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = local_98 - lower;
          while (uVar15 <= uVar12) {
            puVar24 = puVar4 + (local_98 - uVar15);
            uVar12 = uVar15;
            puVar23 = puVar24;
            if (0x1f < local_88) {
              do {
                uVar28 = uVar12 >> 1;
                if (puVar23[uVar28] < uVar1) {
                  puVar23 = puVar23 + uVar28 + 1;
                  uVar28 = ~uVar28 + uVar12;
                }
                uVar12 = uVar28;
              } while (0 < (long)uVar28);
            }
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar23 - (long)puVar4 >> 2);
            uVar13 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar24 - (long)puVar4 >> 2);
            iVar27 = iVar27 + (uVar10 - uVar13);
            local_98 = local_98 - uVar15;
            uVar12 = local_98 - lower;
          }
          for (; uVar15 <= upper - uVar16; uVar16 = uVar16 + uVar15) {
            puVar24 = puVar4 + uVar16;
            uVar12 = uVar15;
            do {
              uVar28 = uVar12 >> 1;
              uVar18 = ~uVar28 + uVar12;
              uVar12 = uVar28;
              if (puVar24[uVar28] < uVar1) {
                puVar24 = puVar24 + uVar28 + 1;
                uVar12 = uVar18;
              }
            } while (0 < (long)uVar12);
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar24 - (long)puVar4 >> 2);
            uVar13 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar16);
            iVar27 = iVar27 + (uVar10 - uVar13);
          }
          sVar19 = sVar19 - 1;
          local_88 = uVar15;
        } while (sVar19 != 0);
      }
      pvVar8 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
               ::operator[](&this_01->tree,0);
      puVar4 = (pvVar8->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_98 != lower) {
        do {
          iVar27 = iVar27 + (puVar4[lower] < uVar1);
          lower = lower + 1;
        } while (local_98 != lower);
      }
      for (; uVar16 != upper; uVar16 = uVar16 + 1) {
        iVar27 = iVar27 + (puVar4[uVar16] < uVar1);
      }
    }
  }
  else {
    this_00 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
              ::operator*(&(this->super_WindowMergeSortTree).mst64);
    pvVar6 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::operator[](&this_00->tree,0);
    pvVar7 = vector<unsigned_long,_true>::operator[](&pvVar6->first,row_idx);
    iVar27 = 1;
    if (lower < upper) {
      iVar26 = upper - 1;
      iVar17 = lower;
      if (iVar26 == lower) {
        uVar12 = 0;
        sVar20 = 0;
        local_88 = 1;
      }
      else {
        local_88 = 1;
        sVar20 = 0;
        do {
          uVar12 = iVar26;
          iVar17 = iVar17 >> 5;
          iVar26 = uVar12 >> 5;
          local_88 = local_88 * 0x20;
          sVar20 = sVar20 + 1;
        } while (iVar17 != iVar26);
        local_98 = local_88 * uVar12 >> 5;
      }
      uVar16 = *pvVar7;
      uVar15 = local_98;
      if (2 < sVar20) {
        uVar18 = iVar17 * local_88;
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this_00->tree,0);
        uVar28 = (long)(pvVar6->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar6->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        if (uVar18 + local_88 <= uVar28) {
          uVar28 = uVar18 + local_88;
        }
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this_00->tree,sVar20);
        puVar2 = (pvVar6->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar22 = puVar2 + uVar18;
        uVar29 = uVar28 - uVar18;
        if (uVar29 != 0 && (long)uVar18 <= (long)uVar28) {
          do {
            uVar28 = uVar29 >> 1;
            uVar14 = ~uVar28 + uVar29;
            uVar29 = uVar28;
            if (puVar22[uVar28] < uVar16) {
              puVar22 = puVar22 + uVar28 + 1;
              uVar29 = uVar14;
            }
          } while (0 < (long)uVar29);
        }
        uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                           ((long)puVar22 - (long)puVar2 >> 3);
        lVar11 = (uVar18 / local_88) * 0x40;
        lVar25 = uVar12 + iVar26 * -0x20 + (uVar10 & 0xffffffffffffffe0);
        local_60 = lVar11 + lVar25;
        local_58 = (lVar11 + lVar25) - 0x20;
        iVar27 = 1;
        uVar12 = sVar20;
        do {
          sVar20 = uVar12 - 1;
          local_88 = local_88 >> 5;
          pvVar6 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                   ::operator[](&this_00->tree,sVar20);
          puVar2 = (pvVar6->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar6 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                   ::operator[](&this_00->tree,uVar12);
          this_02 = &pvVar6->second;
          local_58 = local_58 + 0x1f;
          uVar28 = local_98 - lower;
          while (local_88 <= uVar28) {
            pvVar7 = vector<unsigned_long,_true>::operator[](this_02,local_58);
            vVar3 = *pvVar7;
            puVar22 = puVar2 + vVar3;
            pvVar7 = vector<unsigned_long,_true>::operator[](this_02,local_58 + 0x20);
            uVar28 = *pvVar7 - vVar3;
            if (uVar28 != 0 && (long)vVar3 <= (long)*pvVar7) {
              do {
                uVar18 = uVar28 >> 1;
                uVar29 = ~uVar18 + uVar28;
                uVar28 = uVar18;
                if (puVar22[uVar18] < uVar16) {
                  puVar22 = puVar22 + uVar18 + 1;
                  uVar28 = uVar29;
                }
              } while (0 < (long)uVar28);
            }
            local_98 = local_98 - local_88;
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar22 - (long)puVar2 >> 3);
            iVar27 = iVar27 + (uVar10 - local_98);
            local_58 = local_58 - 1;
            uVar28 = local_98 - lower;
          }
          if (local_98 != lower) {
            pvVar7 = vector<unsigned_long,_true>::operator[](this_02,local_58);
            vVar3 = *pvVar7;
            puVar22 = puVar2 + vVar3;
            pvVar7 = vector<unsigned_long,_true>::operator[](this_02,local_58 + 0x20);
            uVar28 = *pvVar7 - vVar3;
            if (uVar28 != 0 && (long)vVar3 <= (long)*pvVar7) {
              do {
                uVar18 = uVar28 >> 1;
                uVar29 = ~uVar18 + uVar28;
                uVar28 = uVar18;
                if (puVar22[uVar18] < uVar16) {
                  puVar22 = puVar22 + uVar18 + 1;
                  uVar28 = uVar29;
                }
              } while (0 < (long)uVar28);
            }
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar22 - (long)puVar2 >> 3);
            local_58 = (lower / local_88) * 0x40 + (uVar10 & 0xffffffffffffffe0);
          }
          for (; local_88 <= upper - uVar15; uVar15 = uVar15 + local_88) {
            pvVar7 = vector<unsigned_long,_true>::operator[](this_02,local_60);
            vVar3 = *pvVar7;
            puVar22 = puVar2 + vVar3;
            pvVar7 = vector<unsigned_long,_true>::operator[](this_02,local_60 + 0x20);
            uVar28 = *pvVar7 - vVar3;
            if (uVar28 != 0 && (long)vVar3 <= (long)*pvVar7) {
              do {
                uVar18 = uVar28 >> 1;
                uVar29 = ~uVar18 + uVar28;
                uVar28 = uVar18;
                if (puVar22[uVar18] < uVar16) {
                  puVar22 = puVar22 + uVar18 + 1;
                  uVar28 = uVar29;
                }
              } while (0 < (long)uVar28);
            }
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar22 - (long)puVar2 >> 3);
            iVar27 = iVar27 + (uVar10 - uVar15);
            local_60 = local_60 + 1;
          }
          if (uVar15 != upper) {
            pvVar7 = vector<unsigned_long,_true>::operator[](this_02,local_60);
            vVar3 = *pvVar7;
            puVar22 = puVar2 + vVar3;
            pvVar7 = vector<unsigned_long,_true>::operator[](this_02,local_60 + 0x20);
            uVar28 = *pvVar7 - vVar3;
            if (uVar28 != 0 && (long)vVar3 <= (long)*pvVar7) {
              do {
                uVar18 = uVar28 >> 1;
                uVar29 = ~uVar18 + uVar28;
                uVar28 = uVar18;
                if (puVar22[uVar18] < uVar16) {
                  puVar22 = puVar22 + uVar18 + 1;
                  uVar28 = uVar29;
                }
              } while (0 < (long)uVar28);
            }
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar22 - (long)puVar2 >> 3);
            local_60 = (upper / local_88) * 0x40 + (uVar10 & 0xffffffffffffffe0);
          }
          bVar5 = 2 < uVar12;
          uVar12 = sVar20;
        } while (bVar5);
      }
      if (1 < sVar20) {
        sVar20 = sVar20 - 1;
        do {
          uVar28 = local_88 >> 5;
          pvVar6 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                   ::operator[](&this_00->tree,sVar20);
          puVar2 = (pvVar6->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = local_98 - lower;
          while (uVar28 <= uVar12) {
            puVar22 = puVar2 + (local_98 - uVar28);
            uVar12 = uVar28;
            puVar21 = puVar22;
            if (0x1f < local_88) {
              do {
                uVar18 = uVar12 >> 1;
                if (puVar21[uVar18] < uVar16) {
                  puVar21 = puVar21 + uVar18 + 1;
                  uVar18 = ~uVar18 + uVar12;
                }
                uVar12 = uVar18;
              } while (0 < (long)uVar18);
            }
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar21 - (long)puVar2 >> 3);
            uVar13 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar22 - (long)puVar2 >> 3);
            iVar27 = iVar27 + (uVar10 - uVar13);
            local_98 = local_98 - uVar28;
            uVar12 = local_98 - lower;
          }
          for (; uVar28 <= upper - uVar15; uVar15 = uVar15 + uVar28) {
            puVar22 = puVar2 + uVar15;
            uVar12 = uVar28;
            do {
              uVar18 = uVar12 >> 1;
              uVar29 = ~uVar18 + uVar12;
              uVar12 = uVar18;
              if (puVar22[uVar18] < uVar16) {
                puVar22 = puVar22 + uVar18 + 1;
                uVar12 = uVar29;
              }
            } while (0 < (long)uVar12);
            uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar22 - (long)puVar2 >> 3);
            uVar13 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar15);
            iVar27 = iVar27 + (uVar10 - uVar13);
          }
          sVar20 = sVar20 - 1;
          local_88 = uVar28;
        } while (sVar20 != 0);
      }
      pvVar6 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::operator[](&this_00->tree,0);
      puVar2 = (pvVar6->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_98 != lower) {
        do {
          iVar27 = iVar27 + (puVar2[lower] < uVar16);
          lower = lower + 1;
        } while (local_98 != lower);
      }
      for (; uVar15 != upper; uVar15 = uVar15 + 1) {
        iVar27 = iVar27 + (puVar2[uVar15] < uVar16);
      }
    }
  }
  return iVar27;
}

Assistant:

idx_t WindowTokenTree::Rank(const idx_t lower, const idx_t upper, const idx_t row_idx) const {
	if (mst64) {
		return TokenRank(*mst64, lower, upper, row_idx);
	} else {
		return TokenRank(*mst32, lower, upper, row_idx);
	}
}